

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool ParameterTraits<bool>::convert(string *v,RepType *r)

{
  bool bVar1;
  RepType RVar2;
  locale local_20 [8];
  
  std::locale::locale(local_20);
  OpenMD::toLower<std::__cxx11::string>(v,local_20);
  std::locale::~locale(local_20);
  bVar1 = std::operator==(v,"true");
  RVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(v,"false");
    RVar2 = false;
    if (!bVar1) {
      return false;
    }
  }
  *r = RVar2;
  return true;
}

Assistant:

static bool convert(std::string v, RepType& r) {
    OpenMD::toLower(v);
    bool result = false;
    if (v == "true") {
      r      = true;
      result = true;
    } else if (v == "false") {
      r      = false;
      result = true;
    }

    return result;
  }